

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariable.cpp
# Opt level: O0

StdVarPtr *
KDIS::DATA_TYPE::StandardVariable::FactoryDecodeStandardVariable
          (StdVarPtr *__return_storage_ptr__,KDataStream *stream)

{
  KUINT16 KVar1;
  StandardVariableType SVar2;
  KException *pKVar3;
  IOCommunicationsNode *this;
  IOEffect *this_00;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  KString local_218;
  stringstream local_1f8 [8];
  KStringStream ss;
  ostream local_1e8 [380];
  undefined4 local_6c;
  StandardVariable *local_68;
  StandardVariable *p;
  StandardVariable recordHeader;
  KUINT16 savePos;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)__return_storage_ptr__;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 6) {
    recordHeader.m_ui32Type._3_1_ = 1;
    pKVar3 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"FactoryDecodeStandardVariable",&local_39);
    KException::KException(pKVar3,&local_38,2);
    recordHeader.m_ui32Type._3_1_ = 0;
    __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
  }
  recordHeader.m_ui32Type._0_2_ = KDataStream::GetCurrentWritePosition(local_18);
  StandardVariable((StandardVariable *)&p,local_18);
  KDataStream::SetCurrentWritePosition(local_18,(KUINT16)recordHeader.m_ui32Type);
  SVar2 = GetStandardVariableType((StandardVariable *)&p);
  local_68 = FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode(SVar2,local_18);
  if (local_68 == (StandardVariable *)0x0) {
    SVar2 = GetStandardVariableType((StandardVariable *)&p);
    if (SVar2 == IOEffectRecord) {
      this_00 = (IOEffect *)operator_new(0x18);
      IOEffect::IOEffect(this_00,local_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr
                (__return_storage_ptr__,(StandardVariable *)this_00);
    }
    else {
      if (SVar2 != IOCommunicationsNodeRecord) {
        std::__cxx11::stringstream::stringstream(local_1f8);
        poVar4 = std::operator<<(local_1e8,"Unsupported StandardVariable type(");
        SVar2 = GetStandardVariableType((StandardVariable *)&p);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,SVar2);
        std::operator<<(poVar4,").");
        pKVar3 = (KException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"FactoryDecodeStandardVariable",&local_219);
        std::__cxx11::stringstream::str();
        KException::KException<std::__cxx11::string>(pKVar3,&local_218,9,&local_240);
        __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
      }
      this = (IOCommunicationsNode *)operator_new(0x20);
      IOCommunicationsNode::IOCommunicationsNode(this,local_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr
                (__return_storage_ptr__,(StandardVariable *)this);
    }
  }
  else {
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr(__return_storage_ptr__,local_68);
  }
  local_6c = 1;
  ~StandardVariable((StandardVariable *)&p);
  return __return_storage_ptr__;
}

Assistant:

StdVarPtr StandardVariable::FactoryDecodeStandardVariable(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < STANDARD_VARIABLE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    // We want to peek at the next data and then roll back for a full decode.
    KUINT16 savePos = stream.GetCurrentWritePosition();

    // First decode the header so we can determine what type of record we are dealing with.
    StandardVariable recordHeader( stream );

    // Reset stream
    stream.SetCurrentWritePosition( savePos );

	// First check for a custom decoder.
	StandardVariable * p = FactoryDecode( recordHeader.GetStandardVariableType(), stream );

	if( p )
	{
		return StdVarPtr( p );
	}

	// Check for a KDIS implementation of the type.
    switch( recordHeader.GetStandardVariableType() )
    {
		case IOCommunicationsNodeRecord   : return new IOCommunicationsNode( stream );
		case IOEffectRecord               : return new IOEffect( stream );

		// TODO: DE Records
		//case DEPrecisionAimpointRecord        : return new IOEffect( stream );
		//case DEAreaAimpointRecord             : return new IOEffect( stream );
    }

    /*****************************************************************

    We could choose to ignore the record. To do so uncomment the following
    and comment out the exception throwing.

    // Move the buffer to the next readable data.
    stream.SetCurrentWritePosition( ui16SavePos + recordHeader.GetRecordLength() );
    return 0; // make sure the null ptr is handled.

    *****************************************************************/

    // We could not decode the StandardVariable child class. We will treat this as an error.	
	KStringStream ss;
	ss << "Unsupported StandardVariable type(" << recordHeader.GetStandardVariableType() << ").";
	throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, ss.str() );
}